

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void sha512_update_block(void *vctx,uint8_t *inp)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint64_t *puVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong *local_108;
  ulong auStack_b8 [17];
  
  uVar1 = *vctx;
  uVar2 = *(ulong *)((long)vctx + 8);
  uVar3 = *(ulong *)((long)vctx + 0x10);
  uVar4 = *(ulong *)((long)vctx + 0x18);
  uVar5 = *(ulong *)((long)vctx + 0x20);
  uVar6 = *(ulong *)((long)vctx + 0x28);
  uVar7 = *(ulong *)((long)vctx + 0x30);
  uVar8 = *(ulong *)((long)vctx + 0x38);
  puVar20 = K;
  uVar14 = 0;
  uVar17 = uVar5;
  uVar9 = uVar2;
  uVar12 = uVar3;
  uVar15 = uVar4;
  uVar18 = uVar1;
  uVar11 = uVar6;
  uVar21 = uVar8;
  uVar19 = uVar7;
  local_108 = (ulong *)inp;
  do {
    uVar23 = uVar19;
    uVar19 = uVar11;
    uVar16 = uVar18;
    uVar13 = uVar12;
    uVar12 = uVar9;
    uVar11 = uVar17;
    if (uVar14 < 0x10) {
      uVar17 = *local_108;
      uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
               (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
               (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28
               | uVar17 << 0x38;
      auStack_b8[uVar14] = uVar17;
      local_108 = local_108 + 1;
    }
    else {
      uVar10 = (uint)uVar14;
      uVar17 = auStack_b8[uVar10 + 0xe & 0xf];
      uVar9 = auStack_b8[uVar10 + 1 & 0xf];
      uVar17 = (uVar17 >> 6 ^ (uVar17 << 3 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13)) +
               auStack_b8[uVar10 + 9 & 0xf] + auStack_b8[uVar10 & 0xf] +
               (uVar9 >> 7 ^
               (uVar9 << 0x38 | uVar9 >> 8) ^ (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f));
      auStack_b8[uVar10 & 0xf] = uVar17;
    }
    lVar22 = uVar21 + ((uVar19 ^ uVar23) & uVar11 ^ uVar23) +
             ((uVar11 << 0x17 | uVar11 >> 0x29) ^
             (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe)) + uVar17 +
             *puVar20;
    uVar17 = uVar15 + lVar22;
    uVar18 = (uVar13 & uVar12 ^ (uVar13 ^ uVar12) & uVar16) +
             ((uVar16 << 0x19 | uVar16 >> 0x27) ^
             (uVar16 << 0x1e | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar22;
    uVar14 = uVar14 + 1;
    puVar20 = puVar20 + 1;
    uVar9 = uVar16;
    uVar15 = uVar13;
    uVar21 = uVar23;
  } while (uVar14 != 0x50);
  *(ulong *)vctx = uVar18 + uVar1;
  *(ulong *)((long)vctx + 8) = uVar16 + uVar2;
  *(ulong *)((long)vctx + 0x10) = uVar12 + uVar3;
  *(ulong *)((long)vctx + 0x18) = uVar13 + uVar4;
  *(ulong *)((long)vctx + 0x20) = uVar17 + uVar5;
  *(ulong *)((long)vctx + 0x28) = uVar11 + uVar6;
  *(ulong *)((long)vctx + 0x30) = uVar19 + uVar7;
  *(ulong *)((long)vctx + 0x38) = uVar23 + uVar8;
  *(int *)((long)vctx + 0xc0) = *(int *)((long)vctx + 0xc0) + 1;
  return;
}

Assistant:

static void sha512_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha512_context *ctx = vctx;

  uint64_t W[16];

  uint64_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  size_t t;
  for (t = 0; t < 80; t++)
  {
    if (t < 16)
    {
      W[t] = Wt = read64_be(inp);
      inp += 8;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint64_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint64_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}